

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.cpp
# Opt level: O2

size_t duckdb_zstd::HUF_readDTableX2_wksp
                 (HUF_DTable *DTable,void *src,size_t srcSize,void *workSpace,size_t wkspSize,
                 int flags)

{
  U32 *pUVar1;
  HUF_DTable *pHVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  byte bVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  U32 UVar10;
  int iVar11;
  long lVar12;
  HUF_DTable *pHVar13;
  U32 seq;
  U32 tableLog_00;
  long lVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  uint uVar20;
  U32 nbBits;
  size_t sVar21;
  int local_d8;
  U32 nbSymbols;
  U32 tableLog;
  HUF_DTable *local_a8;
  HUF_DTable *local_a0;
  ulong local_98;
  size_t local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  HUF_DTable *local_68;
  void *local_60;
  ulong local_58;
  long local_50;
  ulong local_48;
  long local_40;
  long local_38;
  
  if (wkspSize < 0x84c) {
    sVar21 = 0xffffffffffffffff;
  }
  else {
    uVar3 = *DTable;
    tableLog_00 = uVar3 & 0xff;
    *(undefined8 *)((long)workSpace + 0x2d0) = 0;
    *(undefined8 *)((long)workSpace + 0x2d8) = 0;
    *(undefined8 *)((long)workSpace + 0x2c0) = 0;
    *(undefined8 *)((long)workSpace + 0x2c8) = 0;
    *(undefined8 *)((long)workSpace + 0x2b0) = 0;
    *(undefined8 *)((long)workSpace + 0x2b8) = 0;
    *(undefined8 *)((long)workSpace + 0x2a0) = 0;
    *(undefined8 *)((long)workSpace + 0x2a8) = 0;
    *(undefined8 *)((long)workSpace + 0x290) = 0;
    *(undefined8 *)((long)workSpace + 0x298) = 0;
    *(undefined8 *)((long)workSpace + 0x280) = 0;
    *(undefined8 *)((long)workSpace + 0x288) = 0;
    *(undefined8 *)((long)workSpace + 0x270) = 0;
    *(undefined8 *)((long)workSpace + 0x278) = 0;
    sVar21 = 0xffffffffffffffd4;
    if (tableLog_00 < 0xd) {
      local_90 = HUF_readStats_wksp((BYTE *)((long)workSpace + 0x3e0),0x100,
                                    (U32 *)((long)workSpace + 0x270),&nbSymbols,&tableLog,src,
                                    srcSize,(void *)((long)workSpace + 0x4e0),0x36c,flags);
      sVar21 = local_90;
      if ((local_90 < 0xffffffffffffff89) &&
         (local_70 = (ulong)tableLog, sVar21 = 0xffffffffffffffd4, tableLog <= tableLog_00)) {
        local_a0 = DTable + 1;
        uVar15 = 0;
        uVar5 = local_70;
        do {
          uVar15 = uVar15 + 1;
          pUVar1 = (U32 *)((long)workSpace + 0x270) + uVar5;
          uVar5 = (ulong)((int)uVar5 - 1);
        } while (*pUVar1 == 0);
        uVar20 = (tableLog - uVar15) + 2;
        uVar5 = (ulong)uVar20;
        iVar11 = (tableLog - uVar15) + 1;
        iVar9 = 0;
        for (lVar12 = 0x9d; lVar12 - 0x9cU < uVar5; lVar12 = lVar12 + 1) {
          iVar7 = *(int *)((long)workSpace + lVar12 * 4);
          *(int *)((long)workSpace + lVar12 * 4 + 0x38) = iVar9;
          iVar9 = iVar7 + iVar9;
        }
        *(int *)((long)workSpace + 0x2a8) = iVar9;
        *(int *)((long)workSpace + uVar5 * 4 + 0x2a8) = iVar9;
        for (uVar16 = 0; nbSymbols != uVar16; uVar16 = uVar16 + 1) {
          uVar18 = (ulong)*(byte *)((long)workSpace + uVar16 + 0x3e0);
          uVar8 = *(uint *)((long)workSpace + uVar18 * 4 + 0x2a8);
          *(uint *)((long)workSpace + uVar18 * 4 + 0x2a8) = uVar8 + 1;
          *(char *)((long)workSpace + (ulong)uVar8 + 0x2e0) = (char)uVar16;
        }
        if (tableLog_00 == 0xc && tableLog < 0xc) {
          tableLog_00 = 0xb;
        }
        *(undefined4 *)((long)workSpace + 0x2a8) = 0;
        iVar7 = tableLog_00 - tableLog;
        iVar9 = 0;
        for (uVar16 = 1; uVar16 < uVar5; uVar16 = uVar16 + 1) {
          iVar4 = *(int *)((long)workSpace + uVar16 * 4 + 0x270);
          bVar6 = (byte)iVar7;
          *(int *)((long)workSpace + uVar16 * 4) = iVar9;
          iVar7 = iVar7 + 1;
          iVar9 = (iVar4 << (bVar6 & 0x1f)) + iVar9;
        }
        lVar12 = (ulong)uVar15 * 0x34;
        for (uVar8 = uVar15; uVar16 = 1, uVar8 < (tableLog_00 - uVar15) + 1; uVar8 = uVar8 + 1) {
          for (; uVar16 < uVar5; uVar16 = uVar16 + 1) {
            *(uint *)((long)workSpace + uVar16 * 4 + lVar12) =
                 *(uint *)((long)workSpace + uVar16 * 4) >> ((byte)uVar8 & 0x1f);
          }
          lVar12 = lVar12 + 0x34;
        }
        local_88 = (ulong)((tableLog + 1) - tableLog_00);
        local_38 = (long)(int)uVar20;
        if (iVar11 < 1) {
          iVar11 = 0;
        }
        local_80 = (ulong)(iVar11 + 1);
        local_68 = DTable + 7;
        local_d8 = tableLog * 2 + 1;
        iVar9 = local_d8 - tableLog_00;
        local_78 = 1;
        local_a8 = DTable;
        while( true ) {
          iVar11 = 1;
          if (1 < iVar9) {
            iVar11 = iVar9;
          }
          if (local_78 == local_80) break;
          lVar12 = (long)*(int *)((long)workSpace + local_78 * 4 + 0x2a4);
          lVar19 = (long)*(int *)((long)workSpace + local_78 * 4 + 0x2a8);
          uVar20 = (tableLog + 1) - (int)local_78;
          uVar5 = (ulong)*(uint *)((long)workSpace + local_78 * 4);
          if (tableLog_00 - uVar20 < uVar15) {
            HUF_fillDTableX2ForWeight
                      ((HUF_DEltX2 *)(local_a0 + uVar5),
                       (sortedSymbol_t *)((long)workSpace + lVar12 + 0x2e0),
                       (sortedSymbol_t *)((long)workSpace + lVar19 + 0x2e0),uVar20,tableLog_00,0,1);
          }
          else {
            lVar14 = local_70 * 0x34;
            iVar7 = 1 << ((byte)(tableLog_00 - uVar20) & 0x1f);
            UVar10 = local_d8 - iVar11;
            uVar8 = (int)local_88 + uVar20;
            local_98 = 1;
            if (1 < (int)uVar8) {
              local_98 = (ulong)uVar8;
            }
            local_60 = (void *)((ulong)uVar20 * 0x34 + (long)workSpace);
            local_58 = (ulong)(uVar20 * 0x10000 + 0x1000000);
            local_50 = lVar19;
            while (lVar12 != local_50) {
              lVar19 = (long)(int)uVar5;
              pHVar2 = local_a0 + lVar19;
              bVar6 = *(byte *)((long)workSpace + lVar12 + 0x2e0);
              uVar16 = local_98;
              nbBits = UVar10;
              local_48 = uVar5;
              local_40 = lVar12;
              if (1 < (int)uVar8) {
                lVar12 = (ulong)((uint)local_58 | (uint)bVar6) * 0x100000001;
                pHVar13 = pHVar2;
                if (iVar7 != 2) {
                  if (iVar7 != 4) {
                    iVar11 = *(int *)((long)local_60 + local_98 * 4);
                    for (lVar17 = 0; lVar17 < iVar11; lVar17 = lVar17 + 8) {
                      *(long *)(local_68 + lVar19 + lVar17 + -6) = lVar12;
                      *(long *)(local_68 + lVar19 + lVar17 + -4) = lVar12;
                      *(long *)(local_68 + lVar19 + lVar17 + -2) = lVar12;
                      *(long *)(local_68 + lVar19 + lVar17) = lVar12;
                    }
                    goto LAB_003d2d18;
                  }
                  *(long *)pHVar2 = lVar12;
                  pHVar13 = pHVar2 + 2;
                }
                *(long *)pHVar13 = lVar12;
              }
LAB_003d2d18:
              for (; (long)uVar16 < local_38; uVar16 = uVar16 + 1) {
                HUF_fillDTableX2ForWeight
                          ((HUF_DEltX2 *)(pHVar2 + *(uint *)((long)workSpace + uVar16 * 4 + lVar14))
                           ,(sortedSymbol_t *)
                            ((long)workSpace +
                            (long)*(int *)((long)workSpace + uVar16 * 4 + 0x2a4) + 0x2e0),
                           (sortedSymbol_t *)
                           ((long)workSpace +
                           (long)*(int *)((long)workSpace + uVar16 * 4 + 0x2a8) + 0x2e0),nbBits,
                           tableLog_00,(ushort)bVar6,2);
                nbBits = nbBits - 1;
              }
              uVar5 = (ulong)(uint)((int)local_48 + iVar7);
              lVar12 = local_40 + 1;
            }
          }
          local_78 = local_78 + 1;
          local_70 = (ulong)((int)local_70 - 1);
          local_d8 = local_d8 + -1;
          iVar9 = iVar9 + -1;
        }
        *(char *)local_a8 = (char)uVar3;
        *(undefined1 *)((long)local_a8 + 1) = 1;
        *(char *)((long)local_a8 + 2) = (char)tableLog_00;
        *(char *)((long)local_a8 + 3) = (char)(uVar3 >> 0x18);
        sVar21 = local_90;
      }
    }
  }
  return sVar21;
}

Assistant:

size_t HUF_readDTableX2_wksp(HUF_DTable* DTable,
                       const void* src, size_t srcSize,
                             void* workSpace, size_t wkspSize, int flags)
{
    U32 tableLog, maxW, nbSymbols;
    DTableDesc dtd = HUF_getDTableDesc(DTable);
    U32 maxTableLog = dtd.maxTableLog;
    size_t iSize;
    void* dtPtr = DTable+1;   /* force compiler to avoid strict-aliasing */
    HUF_DEltX2* const dt = (HUF_DEltX2*)dtPtr;
    U32 *rankStart;

    HUF_ReadDTableX2_Workspace* const wksp = (HUF_ReadDTableX2_Workspace*)workSpace;

    if (sizeof(*wksp) > wkspSize) return ERROR(GENERIC);

    rankStart = wksp->rankStart0 + 1;
    ZSTD_memset(wksp->rankStats, 0, sizeof(wksp->rankStats));
    ZSTD_memset(wksp->rankStart0, 0, sizeof(wksp->rankStart0));

    DEBUG_STATIC_ASSERT(sizeof(HUF_DEltX2) == sizeof(HUF_DTable));   /* if compiler fails here, assertion is wrong */
    if (maxTableLog > HUF_TABLELOG_MAX) return ERROR(tableLog_tooLarge);
    /* ZSTD_memset(weightList, 0, sizeof(weightList)); */  /* is not necessary, even though some analyzer complain ... */

    iSize = HUF_readStats_wksp(wksp->weightList, HUF_SYMBOLVALUE_MAX + 1, wksp->rankStats, &nbSymbols, &tableLog, src, srcSize, wksp->calleeWksp, sizeof(wksp->calleeWksp), flags);
    if (HUF_isError(iSize)) return iSize;

    /* check result */
    if (tableLog > maxTableLog) return ERROR(tableLog_tooLarge);   /* DTable can't fit code depth */
    if (tableLog <= HUF_DECODER_FAST_TABLELOG && maxTableLog > HUF_DECODER_FAST_TABLELOG) maxTableLog = HUF_DECODER_FAST_TABLELOG;

    /* find maxWeight */
    for (maxW = tableLog; wksp->rankStats[maxW]==0; maxW--) {}  /* necessarily finds a solution before 0 */

    /* Get start index of each weight */
    {   U32 w, nextRankStart = 0;
        for (w=1; w<maxW+1; w++) {
            U32 curr = nextRankStart;
            nextRankStart += wksp->rankStats[w];
            rankStart[w] = curr;
        }
        rankStart[0] = nextRankStart;   /* put all 0w symbols at the end of sorted list*/
        rankStart[maxW+1] = nextRankStart;
    }

    /* sort symbols by weight */
    {   U32 s;
        for (s=0; s<nbSymbols; s++) {
            U32 const w = wksp->weightList[s];
            U32 const r = rankStart[w]++;
            wksp->sortedSymbol[r].symbol = (BYTE)s;
        }
        rankStart[0] = 0;   /* forget 0w symbols; this is beginning of weight(1) */
    }

    /* Build rankVal */
    {   U32* const rankVal0 = wksp->rankVal[0];
        {   int const rescale = (maxTableLog-tableLog) - 1;   /* tableLog <= maxTableLog */
            U32 nextRankVal = 0;
            U32 w;
            for (w=1; w<maxW+1; w++) {
                U32 curr = nextRankVal;
                nextRankVal += wksp->rankStats[w] << (w+rescale);
                rankVal0[w] = curr;
        }   }
        {   U32 const minBits = tableLog+1 - maxW;
            U32 consumed;
            for (consumed = minBits; consumed < maxTableLog - minBits + 1; consumed++) {
                U32* const rankValPtr = wksp->rankVal[consumed];
                U32 w;
                for (w = 1; w < maxW+1; w++) {
                    rankValPtr[w] = rankVal0[w] >> consumed;
    }   }   }   }

    HUF_fillDTableX2(dt, maxTableLog,
                   wksp->sortedSymbol,
                   wksp->rankStart0, wksp->rankVal, maxW,
                   tableLog+1);

    dtd.tableLog = (BYTE)maxTableLog;
    dtd.tableType = 1;
    ZSTD_memcpy(DTable, &dtd, sizeof(dtd));
    return iSize;
}